

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkTransferOrder(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  int iVar1;
  int iVar2;
  Abc_Nam_t *p;
  Abc_Nam_t *p_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  void **ppvVar5;
  Abc_Nam_t *pStrsCo;
  Abc_Nam_t *pStrsCi;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew_local;
  Abc_Ntk_t *pNtkOld_local;
  
  p = Abc_NtkNameMan(pNtkOld,0);
  p_00 = Abc_NtkNameMan(pNtkOld,1);
  iVar1 = Abc_NtkPiNum(pNtkOld);
  iVar2 = Abc_NtkPiNum(pNtkNew);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x19e,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkPoNum(pNtkOld);
  iVar2 = Abc_NtkPoNum(pNtkNew);
  if (iVar1 == iVar2) {
    iVar1 = Abc_NtkLatchNum(pNtkOld);
    iVar2 = Abc_NtkLatchNum(pNtkNew);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                    ,0x1a0,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pStrsCi._4_4_ = 0;
    while( true ) {
      iVar1 = Abc_NtkCiNum(pNtkNew);
      if (iVar1 <= pStrsCi._4_4_) {
        pStrsCi._4_4_ = 0;
        while( true ) {
          iVar1 = Abc_NtkCoNum(pNtkNew);
          if (iVar1 <= pStrsCi._4_4_) {
            Abc_NamDeref(p);
            Abc_NamDeref(p_00);
            ppvVar5 = Vec_PtrArray(pNtkNew->vPis);
            iVar1 = Vec_PtrSize(pNtkNew->vPis);
            qsort(ppvVar5,(long)iVar1,8,Abc_NodeCompareIndexes);
            ppvVar5 = Vec_PtrArray(pNtkNew->vPos);
            iVar1 = Vec_PtrSize(pNtkNew->vPos);
            qsort(ppvVar5,(long)iVar1,8,Abc_NodeCompareIndexes);
            ppvVar5 = Vec_PtrArray(pNtkNew->vCis);
            iVar1 = Vec_PtrSize(pNtkNew->vCis);
            qsort(ppvVar5,(long)iVar1,8,Abc_NodeCompareIndexes);
            ppvVar5 = Vec_PtrArray(pNtkNew->vCos);
            iVar1 = Vec_PtrSize(pNtkNew->vCos);
            qsort(ppvVar5,(long)iVar1,8,Abc_NodeCompareIndexes);
            for (pStrsCi._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtkNew), pStrsCi._4_4_ < iVar1;
                pStrsCi._4_4_ = pStrsCi._4_4_ + 1) {
              pAVar3 = Abc_NtkCi(pNtkNew,pStrsCi._4_4_);
              (pAVar3->field_6).iTemp = 0;
            }
            for (pStrsCi._4_4_ = 0; iVar1 = Abc_NtkCoNum(pNtkNew), pStrsCi._4_4_ < iVar1;
                pStrsCi._4_4_ = pStrsCi._4_4_ + 1) {
              pAVar3 = Abc_NtkCo(pNtkNew,pStrsCi._4_4_);
              (pAVar3->field_6).iTemp = 0;
            }
            return;
          }
          pAVar3 = Abc_NtkCo(pNtkNew,pStrsCi._4_4_);
          pcVar4 = Abc_ObjName(pAVar3);
          iVar1 = Abc_NamStrFind(p_00,pcVar4);
          (pAVar3->field_6).iTemp = iVar1;
          if (((pAVar3->field_6).iTemp < 1) ||
             (iVar1 = (pAVar3->field_6).iTemp, iVar2 = Abc_NtkCoNum(pNtkNew), iVar2 < iVar1)) break;
          pStrsCi._4_4_ = pStrsCi._4_4_ + 1;
        }
        __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                      ,0x1aa,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      pAVar3 = Abc_NtkCi(pNtkNew,pStrsCi._4_4_);
      pcVar4 = Abc_ObjName(pAVar3);
      iVar1 = Abc_NamStrFind(p,pcVar4);
      (pAVar3->field_6).iTemp = iVar1;
      if (((pAVar3->field_6).iTemp < 1) ||
         (iVar1 = (pAVar3->field_6).iTemp, iVar2 = Abc_NtkCiNum(pNtkNew), iVar2 < iVar1)) break;
      pStrsCi._4_4_ = pStrsCi._4_4_ + 1;
    }
    __assert_fail("pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x1a5,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                ,0x19f,"void Abc_NtkTransferOrder(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferOrder( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    Abc_Obj_t * pObj;  int i;
    Abc_Nam_t * pStrsCi = Abc_NtkNameMan( pNtkOld, 0 );
    Abc_Nam_t * pStrsCo = Abc_NtkNameMan( pNtkOld, 1 );
    assert( Abc_NtkPiNum(pNtkOld) == Abc_NtkPiNum(pNtkNew) );
    assert( Abc_NtkPoNum(pNtkOld) == Abc_NtkPoNum(pNtkNew) );
    assert( Abc_NtkLatchNum(pNtkOld) == Abc_NtkLatchNum(pNtkNew) );
    // transfer to the new network
    Abc_NtkForEachCi( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCi, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCiNum(pNtkNew) );
    }
    Abc_NtkForEachCo( pNtkNew, pObj, i )
    {
        pObj->iTemp = Abc_NamStrFind(pStrsCo, Abc_ObjName(pObj));
        assert( pObj->iTemp > 0 && pObj->iTemp <= Abc_NtkCoNum(pNtkNew) );
    }
    Abc_NamDeref( pStrsCi );
    Abc_NamDeref( pStrsCo );
    // order PI/PO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vPis), (size_t)Vec_PtrSize(pNtkNew->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vPos), (size_t)Vec_PtrSize(pNtkNew->vPos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CI/CO 
    qsort( (void *)Vec_PtrArray(pNtkNew->vCis), (size_t)Vec_PtrSize(pNtkNew->vCis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    qsort( (void *)Vec_PtrArray(pNtkNew->vCos), (size_t)Vec_PtrSize(pNtkNew->vCos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareIndexes );
    // order CIs/COs first PIs/POs(Asserts) then latches
    //Abc_NtkOrderCisCos( pNtk );
    // clean the copy fields
    Abc_NtkForEachCi( pNtkNew, pObj, i )
        pObj->iTemp = 0;
    Abc_NtkForEachCo( pNtkNew, pObj, i )
        pObj->iTemp = 0;
}